

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Module::addFunction(Module *this,Function *fun)

{
  Function *local_18;
  Function *fun_local;
  Module *this_local;
  
  local_18 = fun;
  fun_local = (Function *)this;
  std::vector<spv::Function_*,_dxil_spv::ThreadLocalAllocator<spv::Function_*>_>::push_back
            (&this->functions,&local_18);
  return;
}

Assistant:

void addFunction(Function *fun) { functions.push_back(fun); }